

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O3

void __thiscall DataSet::print(DataSet *this,uint n)

{
  Shape *pSVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  char local_42 [2];
  ulong local_40;
  Matrix *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Dataset [",9);
  pSVar1 = Matrix::shape(&this->m_inputSet);
  poVar2 = operator<<((ostream *)&std::cout,pSVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] - [",5);
  local_38 = &this->m_outputSet;
  pSVar1 = Matrix::shape(local_38);
  poVar2 = operator<<(poVar2,pSVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]: ",3);
  local_42[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_42 + 1,1);
  if (n != 0) {
    uVar4 = 0;
    local_40 = (ulong)n;
    do {
      pSVar1 = Matrix::shape(&this->m_inputSet);
      if ((pSVar1->field_0).m_dims[0] <= uVar4) {
        return;
      }
      if ((this->m_inputSet).m_shape.field_0.m_dims[1] != 0) {
        uVar3 = 0;
        do {
          poVar2 = std::ostream::_M_insert<double>
                             (*(double *)
                               (*(long *)&(this->m_inputSet).m_vals.
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar4].
                                          super__Vector_base<double,_std::allocator<double>_> +
                               uVar3 * 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,",\t\t",3);
          uVar3 = uVar3 + 1;
        } while (uVar3 < (this->m_inputSet).m_shape.field_0.m_dims[1]);
      }
      poVar2 = std::ostream::_M_insert<double>
                         (**(double **)
                            &(local_38->m_vals).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl);
      local_42[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_42,1);
      uVar4 = uVar4 + 1;
    } while (uVar4 != local_40);
  }
  return;
}

Assistant:

void DataSet::print(uint n){
    std::cout<<"Dataset ["<<m_inputSet.shape()<<"] - ["<<m_outputSet.shape()<<"]: "<<'\n';
    for(uint i=0;i<n && i<m_inputSet.shape().n_row;++i){
        for(uint j=0;j<m_inputSet.m_shape.n_col;++j){
            std::cout<<m_inputSet.m_vals[i][j]<<",\t\t";
        }
        std::cout<<m_outputSet.m_vals[i][0]<<'\n';
    }
}